

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conio2.h
# Opt level: O0

int getche(void)

{
  int iVar1;
  undefined1 local_80 [4];
  int ch;
  termios newattr;
  termios oldattr;
  
  tcgetattr(0,(termios *)&newattr.c_ispeed);
  memcpy(local_80,&newattr.c_ispeed,0x3c);
  newattr.c_oflag = newattr.c_oflag & 0xfffffffd;
  tcsetattr(0,0,(termios *)local_80);
  iVar1 = getchar();
  tcsetattr(0,0,(termios *)&newattr.c_ispeed);
  return iVar1;
}

Assistant:

int getche(void)
{
	struct termios oldattr, newattr;
	int ch;
	tcgetattr( STDIN_FILENO, &oldattr );
	newattr = oldattr;
	newattr.c_lflag &= ~( ICANON );
	tcsetattr( STDIN_FILENO, TCSANOW, &newattr );
	ch = getchar();
	tcsetattr( STDIN_FILENO, TCSANOW, &oldattr );
	return ch;
}